

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Roller.cxx
# Opt level: O3

void __thiscall Fl_Roller::draw(Fl_Roller *this)

{
  byte bVar1;
  int iVar2;
  _func_int *p_Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar14;
  int iVar15;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double junk;
  double local_38;
  ulong uVar13;
  ulong uVar16;
  
  if ((char)(this->super_Fl_Valuator).super_Fl_Widget.damage_ < '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  iVar8 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
  iVar4 = Fl::box_dx((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar15 = (this->super_Fl_Valuator).super_Fl_Widget.y_;
  iVar5 = Fl::box_dy((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  uVar6 = Fl::box_dw((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  uVar10 = ~uVar6 + iVar2;
  uVar9 = (ulong)uVar10;
  iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.h_;
  uVar6 = Fl::box_dh((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  if ((int)uVar10 < 1) {
    return;
  }
  uVar6 = iVar2 + ~uVar6;
  uVar18 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    return;
  }
  dVar19 = (this->super_Fl_Valuator).A / (double)(this->super_Fl_Valuator).B;
  dVar20 = 0.0;
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    dVar20 = (double)(int)((this->super_Fl_Valuator).value_ / dVar19) * 0.9974949866040544;
  }
  uVar14 = iVar4 + iVar8;
  uVar16 = (ulong)uVar14;
  uVar12 = iVar5 + iVar15;
  uVar13 = (ulong)uVar12;
  bVar1 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)(this->super_Fl_Valuator).super_Fl_Widget.color_);
  p_Var3 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4];
  if ((bVar1 & 1) == 0) {
    uVar17 = uVar6 >> 2;
    (*p_Var3)(fl_graphics_driver,uVar16,(ulong)(uVar17 + uVar12 + 1),uVar9,
              (ulong)(uVar6 - (uVar17 * 2 + 2)));
    uVar7 = uVar6 + uVar12;
    uVar11 = 0x30;
    iVar8 = uVar17 + 1;
    do {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)uVar11);
      iVar15 = 0;
      if (0x27 < uVar11) {
        iVar15 = (int)((ulong)(uint)(iVar8 * 2) * 0x55555556 >> 0x20) + 1;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,uVar16,(ulong)(uVar12 + iVar15),uVar9,
                 (ulong)(uint)(iVar8 - iVar15));
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)uVar14,(ulong)(uVar7 - iVar8),uVar9,
                 (ulong)(uint)(iVar8 - iVar15));
      uVar11 = uVar11 - 1;
      iVar8 = iVar15;
    } while (iVar15 != 0);
    iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar8 != 0) {
      dVar20 = modf((dVar20 / (double)(uVar6 >> 1)) / 0.2,&local_38);
      dVar20 = dVar20 * 0.2 + -1.5;
      uVar9 = (ulong)(uVar10 + uVar14);
      uVar10 = (uVar10 + uVar14) - 1;
      do {
        dVar19 = sin(dVar20);
        iVar8 = (int)((dVar19 / 0.9974949866040544 + 1.0) * (double)(int)uVar6 * 0.5);
        if (0 < iVar8) {
          if ((int)(uVar6 - 1) <= iVar8) goto LAB_001c7154;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)(uVar14 + 1),(ulong)(iVar8 + uVar12),(ulong)uVar10);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x32);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)(uVar14 + 1),
                     (ulong)(((iVar8 + uVar12) - 1) + (uint)(0.0 <= dVar20) * 2),(ulong)uVar10);
        }
        dVar20 = dVar20 + 0.2;
      } while( true );
    }
  }
  else {
    uVar7 = uVar10 >> 2;
    (*p_Var3)(fl_graphics_driver,(ulong)(uVar7 + uVar14 + 1),uVar13,
              (ulong)(uVar10 - (uVar7 * 2 + 2)),uVar18);
    uVar11 = uVar10 + uVar14;
    uVar17 = 0x30;
    iVar8 = uVar7 + 1;
    do {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)uVar17);
      iVar15 = 0;
      if (0x27 < uVar17) {
        iVar15 = (int)((ulong)(uint)(iVar8 * 2) * 0x55555556 >> 0x20) + 1;
      }
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)(uVar14 + iVar15),uVar13,(ulong)(uint)(iVar8 - iVar15),
                 uVar18);
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                (fl_graphics_driver,(ulong)(uVar11 - iVar8),uVar13,(ulong)(uint)(iVar8 - iVar15),
                 uVar18);
      uVar17 = uVar17 - 1;
      iVar8 = iVar15;
    } while (iVar15 != 0);
    iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar8 != 0) {
      dVar20 = modf((dVar20 / (double)(uVar10 >> 1)) / 0.2,&local_38);
      dVar20 = dVar20 * 0.2 + -1.5;
      uVar9 = (ulong)(uVar6 + uVar12);
      uVar6 = (uVar6 + uVar12) - 1;
      do {
        dVar19 = sin(dVar20);
        iVar8 = (int)((dVar19 / 0.9974949866040544 + 1.0) * (double)(int)uVar10 * 0.5);
        if (0 < iVar8) {
          if ((int)(uVar10 - 1) <= iVar8) goto LAB_001c7232;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,(ulong)(iVar8 + uVar14),(ulong)(uVar12 + 1),(ulong)uVar6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x32);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,(ulong)(((iVar8 + uVar14) - 1) + (uint)(0.0 <= dVar20) * 2),
                     (ulong)(uVar12 + 1),(ulong)uVar6);
        }
        dVar20 = dVar20 + 0.2;
      } while( true );
    }
  }
LAB_001c7310:
  if (Fl::focus_ != (Fl_Widget *)this) {
    return;
  }
  Fl_Widget::draw_focus
            ((Fl_Widget *)this,FL_THIN_UP_FRAME,(this->super_Fl_Valuator).super_Fl_Widget.x_,
             (this->super_Fl_Valuator).super_Fl_Widget.y_,
             (this->super_Fl_Valuator).super_Fl_Widget.w_,
             (this->super_Fl_Valuator).super_Fl_Widget.h_);
  return;
LAB_001c7232:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x2d);
  uVar14 = (uVar10 >> 3) + uVar14 + 1;
  uVar10 = uVar11 - ((uVar10 >> 3) + 1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar14,(ulong)uVar6,(ulong)uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[10])
            (fl_graphics_driver,uVar16,uVar9,uVar13,(ulong)uVar14);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar10,uVar13,(ulong)uVar11);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x34);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar14,(ulong)(uVar12 - 1),(ulong)uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[10])
            (fl_graphics_driver,(ulong)uVar11,uVar13,uVar9,(ulong)uVar10);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar14,uVar9,uVar16);
  goto LAB_001c7310;
LAB_001c7154:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x2d);
  uVar12 = (uVar6 >> 3) + uVar12 + 1;
  uVar6 = uVar7 - ((uVar6 >> 3) + 1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)uVar10,(ulong)uVar12,(ulong)uVar6);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[7])
            (fl_graphics_driver,uVar9,uVar13,uVar16,(ulong)uVar12);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,uVar16,(ulong)uVar6,(ulong)uVar7);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x34);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,uVar16,(ulong)uVar12,(ulong)uVar6);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[7])
            (fl_graphics_driver,uVar16,(ulong)uVar7,uVar9,(ulong)uVar6);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,uVar9,(ulong)uVar12,uVar13);
  goto LAB_001c7310;
}

Assistant:

void Fl_Roller::draw() {
  if (damage()&FL_DAMAGE_ALL) draw_box();
  int X = x()+Fl::box_dx(box());
  int Y = y()+Fl::box_dy(box());
  int W = w()-Fl::box_dw(box())-1;
  int H = h()-Fl::box_dh(box())-1;
  if (W<=0 || H <=0) return;
  int offset = step() ? int(value()/step()) : 0;
  const double ARC = 1.5; // 1/2 the number of radians visible
  const double delta = .2; // radians per knurl
  if (horizontal()) { // horizontal one
    // draw shaded ends of wheel:
    int h1 = W/4+1; // distance from end that shading starts
    fl_color(color()); fl_rectf(X+h1,Y,W-2*h1,H);
    for (int i=0; h1; i++) {
      fl_color((Fl_Color)(FL_GRAY-i-1));
      int h2 = FL_GRAY-i-1 > FL_DARK3 ? 2*h1/3+1 : 0;
      fl_rectf(X+h2,Y,h1-h2,H);
      fl_rectf(X+W-h1,Y,h1-h2,H);
      h1 = h2;
    }
    if (active_r()) {
      // draw ridges:
      double junk;
      for (double yy = -ARC+modf(offset*sin(ARC)/(W/2)/delta,&junk)*delta;;
	   yy += delta) {
	int yy1 = int((sin(yy)/sin(ARC)+1)*W/2);
	if (yy1 <= 0) continue; else if (yy1 >= W-1) break;
	fl_color(FL_DARK3); fl_yxline(X+yy1,Y+1,Y+H-1);
	if (yy < 0) yy1--; else yy1++;
	fl_color(FL_LIGHT1);fl_yxline(X+yy1,Y+1,Y+H-1);
      }
      // draw edges:
      h1 = W/8+1; // distance from end the color inverts
      fl_color(FL_DARK2);
      fl_xyline(X+h1,Y+H-1,X+W-h1);
      fl_color(FL_DARK3);
      fl_yxline(X,Y+H,Y,X+h1);
      fl_xyline(X+W-h1,Y,X+W);
      fl_color(FL_LIGHT2);
      fl_xyline(X+h1,Y-1,X+W-h1);
      fl_yxline(X+W,Y,Y+H,X+W-h1);
      fl_xyline(X+h1,Y+H,X);
    }
  } else { // vertical one
    // draw shaded ends of wheel:
    int h1 = H/4+1; // distance from end that shading starts
    fl_color(color()); fl_rectf(X,Y+h1,W,H-2*h1);
    for (int i=0; h1; i++) {
      fl_color((Fl_Color)(FL_GRAY-i-1));
      int h2 = FL_GRAY-i-1 > FL_DARK3 ? 2*h1/3+1 : 0;
      fl_rectf(X,Y+h2,W,h1-h2);
      fl_rectf(X,Y+H-h1,W,h1-h2);
      h1 = h2;
    }
    if (active_r()) {
      // draw ridges:
      double junk;
      for (double yy = -ARC+modf(offset*sin(ARC)/(H/2)/delta,&junk)*delta;
	   ; yy += delta) {
	int yy1 = int((sin(yy)/sin(ARC)+1)*H/2);
	if (yy1 <= 0) continue; else if (yy1 >= H-1) break;
	fl_color(FL_DARK3); fl_xyline(X+1,Y+yy1,X+W-1);
	if (yy < 0) yy1--; else yy1++;
	fl_color(FL_LIGHT1);fl_xyline(X+1,Y+yy1,X+W-1);
      }
      // draw edges:
      h1 = H/8+1; // distance from end the color inverts
      fl_color(FL_DARK2);
      fl_yxline(X+W-1,Y+h1,Y+H-h1);
      fl_color(FL_DARK3);
      fl_xyline(X+W,Y,X,Y+h1);
      fl_yxline(X,Y+H-h1,Y+H);
      fl_color(FL_LIGHT2);
      fl_yxline(X,Y+h1,Y+H-h1);
      fl_xyline(X,Y+H,X+W,Y+H-h1);
      fl_yxline(X+W,Y+h1,Y);
    }
  }

  if (Fl::focus() == this) draw_focus(FL_THIN_UP_FRAME, x(), y(), w(), h());
}